

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  Expr *pEVar1;
  char *pcVar2;
  int *in_RSI;
  char *in_RDI;
  Expr *pNewExpr;
  Expr *pOldExpr;
  Expr *pPriorSelectCol;
  int i;
  ExprList_item *pOldItem;
  ExprList_item *pItem;
  ExprList *pNew;
  sqlite3 *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa8;
  sqlite3 *db_00;
  Expr *local_48;
  int local_3c;
  int *local_38;
  ExprList_item *local_30;
  ExprList *local_8;
  
  local_48 = (Expr *)0x0;
  if (in_RSI == (int *)0x0) {
    local_8 = (ExprList *)0x0;
  }
  else {
    sqlite3DbMallocSize(in_stack_ffffffffffffff98,(void *)0x1a3c7a);
    local_8 = (ExprList *)sqlite3DbMallocRawNN(in_stack_ffffffffffffffa8,(u64)in_RDI);
    if (local_8 == (ExprList *)0x0) {
      local_8 = (ExprList *)0x0;
    }
    else {
      local_8->nExpr = *in_RSI;
      local_30 = local_8->a;
      local_38 = in_RSI + 2;
      for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
        db_00 = *(sqlite3 **)local_38;
        pEVar1 = sqlite3ExprDup(db_00,(Expr *)in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20)
                               );
        local_30->pExpr = pEVar1;
        if (((db_00 != (sqlite3 *)0x0) && (*(char *)&db_00->pVfs == -0x5a)) &&
           (in_stack_ffffffffffffffa8 = (sqlite3 *)local_30->pExpr,
           in_stack_ffffffffffffffa8 != (sqlite3 *)0x0)) {
          if ((short)in_stack_ffffffffffffffa8->flags == 0) {
            local_48 = (Expr *)in_stack_ffffffffffffffa8->mutex;
            in_stack_ffffffffffffffa8->pDfltColl = (CollSeq *)local_48;
          }
          else {
            in_stack_ffffffffffffffa8->pDfltColl = (CollSeq *)local_48;
          }
        }
        pcVar2 = sqlite3DbStrDup(in_stack_ffffffffffffffa8,in_RDI);
        local_30->zName = pcVar2;
        pcVar2 = sqlite3DbStrDup(in_stack_ffffffffffffffa8,in_RDI);
        local_30->zSpan = pcVar2;
        local_30->sortOrder = (u8)local_38[6];
        local_30->field_0x19 = local_30->field_0x19 & 0xfe;
        local_30->field_0x19 =
             local_30->field_0x19 & 0xfd | (*(byte *)((long)local_38 + 0x19) >> 1 & 1) << 1;
        local_30->field_0x19 =
             local_30->field_0x19 & 0xf7 | (*(byte *)((long)local_38 + 0x19) >> 3 & 1) << 3;
        local_30->u = *(anon_union_4_2_6146edf4_for_u *)(local_38 + 7);
        local_30 = local_30 + 1;
        local_38 = local_38 + 8;
      }
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  Expr *pPriorSelectCol = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr 
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0 
    ){
      assert( pNewExpr->iColumn==0 || i>0 );
      if( pNewExpr->iColumn==0 ){
        assert( pOldExpr->pLeft==pOldExpr->pRight );
        pPriorSelectCol = pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        assert( i>0 );
        assert( pItem[-1].pExpr!=0 );
        assert( pNewExpr->iColumn==pItem[-1].pExpr->iColumn+1 );
        assert( pPriorSelectCol==pItem[-1].pExpr->pLeft );
        pNewExpr->pLeft = pPriorSelectCol;
      }
    }
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->bSpanIsTab = pOldItem->bSpanIsTab;
    pItem->bSorterRef = pOldItem->bSorterRef;
    pItem->u = pOldItem->u;
  }
  return pNew;
}